

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiOutAlsa::~MidiOutAlsa(MidiOutAlsa *this)

{
  undefined8 *puVar1;
  AlsaMidiData *data;
  MidiOutAlsa *this_local;
  
  (this->super_MidiOutApi).super_MidiApi._vptr_MidiApi = (_func_int **)&PTR__MidiOutAlsa_00120bd8;
  closePort(this);
  puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  if (-1 < *(int *)((long)puVar1 + 0xc)) {
    snd_seq_delete_port(*puVar1,*(undefined4 *)((long)puVar1 + 0xc));
  }
  if (puVar1[3] != 0) {
    snd_midi_event_free(puVar1[3]);
  }
  if (puVar1[5] != 0) {
    free((void *)puVar1[5]);
  }
  snd_seq_close(*puVar1);
  if (puVar1 != (undefined8 *)0x0) {
    operator_delete(puVar1,0x58);
  }
  MidiOutApi::~MidiOutApi(&this->super_MidiOutApi);
  return;
}

Assistant:

MidiOutAlsa :: ~MidiOutAlsa()
{
  // Close a connection if it exists.
  MidiOutAlsa::closePort();

  // Cleanup.
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport >= 0 ) snd_seq_delete_port( data->seq, data->vport );
  if ( data->coder ) snd_midi_event_free( data->coder );
  if ( data->buffer ) free( data->buffer );
  snd_seq_close( data->seq );
  delete data;
}